

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning.cpp
# Opt level: O2

void dsu_unite(int u,int v)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = dsu_get(u);
  iVar2 = dsu_get(v);
  uVar3 = rand();
  if (iVar1 != iVar2) {
    iVar4 = iVar2;
    if ((uVar3 & 1) == 0) {
      iVar4 = iVar1;
      iVar1 = iVar2;
    }
    *(int *)((anonymous_namespace)::p + (long)iVar4 * 4) = iVar1;
  }
  return;
}

Assistant:

void dsu_unite(int u, int v) {
    u = dsu_get(u);
    v = dsu_get(v);

    if (rand() & 1)
        swap(u, v);

    if (u != v)
        p[u] = v;
}